

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

void __thiscall TaskProvider::_run(TaskProvider *this,size_t taskCount)

{
  ThreadPool *this_00;
  
  if (((taskCount != 0) && ((this->super_AbstractTaskProvider)._running == false)) &&
     (this_00 = this->_threadPool, this_00 != (ThreadPool *)0x0)) {
    LOCK();
    (this->super_AbstractTaskProvider)._taskCount.super___atomic_base<unsigned_long>._M_i =
         taskCount;
    UNLOCK();
    LOCK();
    (this->super_AbstractTaskProvider)._givenTaskCount.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (this->super_AbstractTaskProvider)._completedTaskCount.super___atomic_base<unsigned_long>._M_i =
         0;
    UNLOCK();
    ThreadPool::add(this_00,&this->super_AbstractTaskProvider,
                    (this->super_AbstractTaskProvider)._taskCount.super___atomic_base<unsigned_long>
                    ._M_i);
    return;
  }
  return;
}

Assistant:

void TaskProvider::_run( size_t taskCount )
{
    if( _ready() && taskCount > 0 ) {
        _taskCount          = taskCount;
        _givenTaskCount     = 0;
        _completedTaskCount = 0;

        _threadPool->add( this, _taskCount );
    }
}